

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingIndex.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1d88::RingIndexTest_RingIndex1_Test::TestBody
          (RingIndexTest_RingIndex1_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long *plVar3;
  ulong uVar4;
  char *pcVar5;
  RingIndex ret;
  RingIndex ret_3;
  AssertionResult gtest_ar;
  RingIndex local_48;
  RingIndex local_38;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  RingIndex local_18;
  
  local_18.idx_max = (RawType)&DAT_00000017;
  local_18.idx = 0;
  local_48.idx_max = local_48.idx_max & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
            (local_28,"++ri","0",&local_18,(int *)&local_48);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x44,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)local_48.idx_max != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_48.idx_max != (long *)0x0)) {
        (**(code **)(*(long *)local_48.idx_max + 8))();
      }
      local_48.idx_max = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.idx_max = local_18.idx_max;
  plVar3 = (long *)0x0;
  if (0xffffffffffffffe8 < local_18.idx) {
    plVar3 = (long *)local_18.idx_max;
  }
  local_48.idx = ((local_18.idx - (long)plVar3) + 0x17) % local_18.idx_max;
  local_38.idx_max = (ulong)local_38.idx_max._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
            (local_28,"ri + 23","0",&local_48,(int *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x45,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)local_48.idx_max != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_48.idx_max != (long *)0x0)) {
        (**(code **)(*(long *)local_48.idx_max + 8))();
      }
      local_48.idx_max = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.idx_max = local_18.idx_max;
  plVar3 = (long *)0x0;
  if (0xffffffffffffffe7 < local_18.idx) {
    plVar3 = (long *)local_18.idx_max;
  }
  local_48.idx = ((local_18.idx - (long)plVar3) + 0x18) % local_18.idx_max;
  local_38.idx_max = CONCAT44(local_38.idx_max._4_4_,1);
  testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
            (local_28,"ri + 24","1",&local_48,(int *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x46,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)local_48.idx_max != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_48.idx_max != (long *)0x0)) {
        (**(code **)(*(long *)local_48.idx_max + 8))();
      }
      local_48.idx_max = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = local_18.idx + 5;
  bVar2 = 0xfffffffffffffffa < local_18.idx;
  local_18.idx = uVar4;
  if (bVar2) {
    local_18.idx = uVar4 - local_18.idx_max;
  }
  local_18.idx = local_18.idx % local_18.idx_max;
  local_48.idx_max = CONCAT44(local_48.idx_max._4_4_,5);
  testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
            (local_28,"ri","5",&local_18,(int *)&local_48);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x48,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)local_48.idx_max != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_48.idx_max != (long *)0x0)) {
        (**(code **)(*(long *)local_48.idx_max + 8))();
      }
      local_48.idx_max = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.idx_max = local_18.idx_max;
  local_48.idx = ((-(ulong)(local_18.idx == 0) | ~local_18.idx_max) + local_18.idx) %
                 local_18.idx_max;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_18.idx_max;
  uVar4 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) % auVar1,0);
  local_38.idx_max = local_18.idx_max;
  plVar3 = (long *)0x0;
  if (CARRY8(local_18.idx,uVar4)) {
    plVar3 = (long *)local_18.idx_max;
  }
  local_38.idx = ((local_18.idx + uVar4) - (long)plVar3) % local_18.idx_max;
  testing::internal::CmpHelperEQ<Sledge::RingIndex,Sledge::RingIndex>
            (local_28,"ri + RingIndex::LIMIT_MAX","ri + (RingIndex::LIMIT_MAX % ri.get_max())",
             &local_48,&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x49,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)local_48.idx_max != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_48.idx_max != (long *)0x0)) {
        (**(code **)(*(long *)local_48.idx_max + 8))();
      }
      local_48.idx_max = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST( RingIndexTest, RingIndex1)
	{
		RingIndex ri(22, 23);
		EXPECT_EQ(++ri, 0);
		EXPECT_EQ(ri + 23, 0);
		EXPECT_EQ(ri + 24, 1);
		ri += 5;
		EXPECT_EQ(ri, 5);
		EXPECT_EQ(ri + RingIndex::LIMIT_MAX, ri + (RingIndex::LIMIT_MAX % ri.get_max()));
	}